

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chorus.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_101d8b::ChorusState::deviceUpdate(ChorusState *this,ALCdevice *Device)

{
  uint uVar1;
  uint32_t uVar2;
  ulong __n;
  size_type sVar3;
  float *__first;
  __normal_iterator<float_*,_std::vector<float,_al::allocator<float,_16UL>_>_> in_RDI;
  anon_struct_128_2_952b89bb *e;
  anon_struct_128_2_952b89bb *__end1;
  anon_struct_128_2_952b89bb *__begin1;
  anon_struct_128_2_952b89bb (*__range1) [2];
  size_t maxlen;
  float frequency;
  float max_delay;
  vector<float,_al::allocator<float,_16UL>_> *in_stack_ffffffffffffff58;
  float *in_stack_ffffffffffffff60;
  __normal_iterator<float_*,_std::vector<float,_al::allocator<float,_16UL>_>_>
  in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  float (*local_68) [16];
  
  uVar1 = float2uint(0.0);
  uVar2 = NextPowerOf2(uVar1 + 1);
  __n = (ulong)uVar2;
  sVar3 = std::vector<float,_al::allocator<float,_16UL>_>::size
                    ((vector<float,_al::allocator<float,_16UL>_> *)((long)in_RDI._M_current + 0x20))
  ;
  if (__n != sVar3) {
    std::vector<float,_al::allocator<float,_16UL>_>::vector
              ((vector<float,_al::allocator<float,_16UL>_> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),__n,
               (allocator_type *)in_RDI._M_current);
    std::vector<float,_al::allocator<float,_16UL>_>::swap
              ((vector<float,_al::allocator<float,_16UL>_> *)in_RDI._M_current,
               (vector<float,_al::allocator<float,_16UL>_> *)in_stack_ffffffffffffff68._M_current);
    std::vector<float,_al::allocator<float,_16UL>_>::~vector
              ((vector<float,_al::allocator<float,_16UL>_> *)in_RDI._M_current);
  }
  std::vector<float,_al::allocator<float,_16UL>_>::begin(in_stack_ffffffffffffff58);
  std::vector<float,_al::allocator<float,_16UL>_>::end(in_stack_ffffffffffffff58);
  std::fill<__gnu_cxx::__normal_iterator<float*,std::vector<float,al::allocator<float,16ul>>>,float>
            (in_RDI,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  for (local_68 = (float (*) [16])(in_RDI._M_current + 0x13);
      local_68 != (float (*) [16])(in_RDI._M_current + 0x53); local_68 = local_68 + 2) {
    __first = std::begin<float,16ul>(local_68);
    std::end<float,16ul>(local_68);
    std::fill<float*,float>(__first,(float *)in_stack_ffffffffffffff58,(float *)0x1c96f7);
    std::begin<float,16ul>(local_68 + 1);
    std::end<float,16ul>(local_68 + 1);
    std::fill<float*,float>(__first,(float *)in_stack_ffffffffffffff58,(float *)0x1c9733);
  }
  return;
}

Assistant:

void ChorusState::deviceUpdate(const ALCdevice *Device)
{
    constexpr float max_delay{maxf(AL_CHORUS_MAX_DELAY, AL_FLANGER_MAX_DELAY)};

    const auto frequency = static_cast<float>(Device->Frequency);
    const size_t maxlen{NextPowerOf2(float2uint(max_delay*2.0f*frequency) + 1u)};
    if(maxlen != mSampleBuffer.size())
        al::vector<float,16>(maxlen).swap(mSampleBuffer);

    std::fill(mSampleBuffer.begin(), mSampleBuffer.end(), 0.0f);
    for(auto &e : mGains)
    {
        std::fill(std::begin(e.Current), std::end(e.Current), 0.0f);
        std::fill(std::begin(e.Target), std::end(e.Target), 0.0f);
    }
}